

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char * parse_identifier(char *src,rtosc_arg_val_t *arg,char *buffer_for_strings,size_t *bufsize)

{
  ushort **ppuVar1;
  long *in_RCX;
  char *in_RDX;
  undefined1 *in_RSI;
  char *in_RDI;
  bool bVar2;
  char *local_18;
  char *local_8;
  
  if ((*in_RDI != '_') && (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*in_RDI] & 0x400) == 0)) {
    return in_RDI;
  }
  *in_RSI = 0x53;
  *(char **)(in_RSI + 8) = in_RDX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  while( true ) {
    bVar2 = true;
    if (*local_8 != '_') {
      ppuVar1 = __ctype_b_loc();
      bVar2 = ((*ppuVar1)[(int)*local_8] & 8) != 0;
    }
    if (!bVar2) break;
    *in_RCX = *in_RCX + -1;
    *local_18 = *local_8;
    local_18 = local_18 + 1;
    local_8 = local_8 + 1;
  }
  *in_RCX = *in_RCX + -1;
  *local_18 = '\0';
  return local_8;
}

Assistant:

const char* parse_identifier(const char* src, rtosc_arg_val_t *arg,
                             char* buffer_for_strings,
                             size_t* bufsize)
{
    if(*src == '_' || isalpha(*src))
    {
        arg->type = 'S';
        arg->val.s = buffer_for_strings;
        for(; *src == '_' || isalnum(*src); ++src)
        {
            assert(*bufsize);
            (*bufsize)--;
            *buffer_for_strings = *src;
            ++buffer_for_strings;
        }
        assert(*bufsize);
        (*bufsize)--;
        *buffer_for_strings = 0;
        ++buffer_for_strings;
    }
    return src;
}